

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::MILSpec::ListType::MergeFrom(ListType *this,ListType *from)

{
  void *pvVar1;
  LogMessage *other;
  ValueType *this_00;
  Dimension *this_01;
  ValueType *from_00;
  Dimension *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
               ,0x12d3);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (ListType *)&_ListType_default_instance_) && (from->type_ != (ValueType *)0x0)) {
    this_00 = mutable_type(this);
    from_00 = from->type_;
    if (from_00 == (ValueType *)0x0) {
      from_00 = (ValueType *)&_ValueType_default_instance_;
    }
    ValueType::MergeFrom(this_00,from_00);
  }
  if ((from != (ListType *)&_ListType_default_instance_) && (from->length_ != (Dimension *)0x0)) {
    this_01 = mutable_length(this);
    from_01 = from->length_;
    if (from_01 == (Dimension *)0x0) {
      from_01 = (Dimension *)&_Dimension_default_instance_;
    }
    Dimension::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

void ListType::MergeFrom(const ListType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.ListType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_type()) {
    mutable_type()->::CoreML::Specification::MILSpec::ValueType::MergeFrom(from.type());
  }
  if (from.has_length()) {
    mutable_length()->::CoreML::Specification::MILSpec::Dimension::MergeFrom(from.length());
  }
}